

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O0

shared_ptr<vmips::VirtReg> __thiscall vmips::Memory::def(Memory *this)

{
  char *pcVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  long *in_RSI;
  shared_ptr<vmips::VirtReg> sVar4;
  Memory *this_local;
  
  pcVar1 = (char *)(**(code **)(*in_RSI + 8))();
  if (*pcVar1 != 'l') {
    lVar2 = (**(code **)(*in_RSI + 8))();
    if (*(char *)(lVar2 + 1) != 'l') {
      std::shared_ptr<vmips::VirtReg>::shared_ptr((shared_ptr<vmips::VirtReg> *)this,(nullptr_t)0x0)
      ;
      _Var3._M_pi = extraout_RDX_00;
      goto LAB_00170944;
    }
  }
  std::shared_ptr<vmips::VirtReg>::shared_ptr
            ((shared_ptr<vmips::VirtReg> *)this,(shared_ptr<vmips::VirtReg> *)(in_RSI + 1));
  _Var3._M_pi = extraout_RDX;
LAB_00170944:
  sVar4.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<vmips::VirtReg>)
         sVar4.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<VirtReg> Memory::def() const {
    if (name()[0] == 'l' || name()[1] == 'l') {
        return target;
    }
    return nullptr;
}